

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O2

void generate_c_code(ParsedOpcodeInfo *info,CCVariant *var,int m68kop,int synop,SymbolTable *sym,
                    char *operand_decls,char *postcode,OpcodeMappingInfo *map)

{
  uint uVar1;
  BOOL BVar2;
  List *pLVar3;
  long lVar4;
  CCVariant *pCVar5;
  ParsedOpcodeInfo *info_00;
  PatternRange *range;
  char (*pacVar6) [16];
  int iVar7;
  long lVar8;
  FILE *pFVar9;
  char *pcVar10;
  CCVariant *pCVar11;
  CCVariant *pCVar12;
  long lVar13;
  char buf2 [6];
  char buf1 [6];
  char buf3 [6];
  BOOL found;
  char buf4 [17];
  PatternRange ranges [32];
  CCVariant local_2438 [102];
  undefined1 auStack_1438 [5128];
  
  pCVar5 = (CCVariant *)sym;
  pcVar10 = operand_decls;
  pLVar3 = copy_list(var->code);
  c_postamble[0] = '\0';
  c_preamble[0] = '\0';
  iVar7 = 1;
  range = ranges;
  do {
    range = range + 1;
    BVar2 = pattern_range(info->opcode_bits,iVar7,range);
    iVar7 = iVar7 + 1;
  } while (BVar2 != FALSE);
  rde_aux(pLVar3,ranges,m68kop,(ParsedOpcodeInfo *)var,pCVar5,(int)pcVar10);
  pLVar3 = reduce(pLVar3,sym,0);
  pFVar9 = syn68k_c_stream;
  pcVar10 = info->name;
  opcode_bits_string(m68kop,info,var,buf4);
  uVar1 = *(uint *)var;
  cc_bits_string(uVar1 & 0x1f,buf1);
  cc_bits_string(uVar1 >> 5 & 0x1f,buf2);
  cc_bits_string(uVar1 >> 10 & 0x1f,buf3);
  fprintf((FILE *)pFVar9,"\n      /* %s %s ms:%s mns:%s needs:%s */\n",pcVar10,buf4,buf1,buf2,buf3);
  fprintf((FILE *)syn68k_c_stream,"      CASE (0x%04X)\n",synop);
  pFVar9 = syn68k_c_stream;
  pcVar10 = info->name;
  opcode_bits_string(m68kop,info,var,buf4);
  uVar1 = *(uint *)var;
  cc_bits_string(uVar1 & 0x1f,buf1);
  cc_bits_string(uVar1 >> 5 & 0x1f,buf2);
  cc_bits_string(uVar1 >> 10 & 0x1f,buf3);
  pCVar5 = (CCVariant *)buf4;
  fprintf((FILE *)pFVar9,"        CASE_PREAMBLE (\"%s\", \"%s\", \"%s\", \"%s\", \"%s\")\n",pcVar10,
          pCVar5,buf1,buf2,buf3);
  fputs(operand_decls,(FILE *)syn68k_c_stream);
  for (lVar4 = 0; lVar4 != 0x1400; lVar4 = lVar4 + 0x400) {
    auStack_1438[lVar4] = 0;
    *(undefined1 *)((long)&ranges[0].index + lVar4) = 0;
  }
  transform_rtvad_aux(pLVar3,pLVar3,(char (*) [5] [1024])ranges);
  lVar13 = 0x117d48;
  pCVar11 = local_2438;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    pCVar12 = pCVar11;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      if (*(char *)pCVar12 != '\0') {
        pCVar5 = pCVar12;
        fprintf((FILE *)syn68k_c_stream,"        %s%s;\n",*(undefined8 *)(lVar13 + lVar8 * 8));
      }
      pCVar12 = (CCVariant *)&pCVar12[0x19].native_code_info;
    }
    lVar13 = lVar13 + 0x28;
    pCVar11 = pCVar11 + 0x80;
  }
  found = FALSE;
  memset(ranges,0,0x200);
  gtd_aux(pLVar3,(BOOL *)ranges,&found);
  if (found != FALSE) {
    fputs(";\n",(FILE *)syn68k_c_stream);
  }
  if ((pLVar3->token).type == TOK_LIST) {
    if (c_preamble[0] != '\0') {
      fprintf((FILE *)syn68k_c_stream,"        %s\n",c_preamble);
    }
    pFVar9 = syn68k_c_stream;
    fputs("        ",(FILE *)syn68k_c_stream);
    generate_code_for_list(pLVar3,(int)pFVar9,info_00,pCVar5);
    fputs(";\n",(FILE *)syn68k_c_stream);
    if (c_postamble[0] != '\0') {
      fprintf((FILE *)syn68k_c_stream,"        %s\n",c_postamble);
    }
    pacVar6 = generate_c_code::cc_name;
    lVar4 = 4;
    while( true ) {
      uVar1 = *(uint *)var;
      if (lVar4 == 0) break;
      if ((1 << ((byte)lVar4 & 0x1f) & uVar1 >> 0xf & 0x1e) != 0) {
        fprintf((FILE *)syn68k_c_stream,"        %s = %d;\n",pacVar6,
                (ulong)(((uVar1 >> 0x14 & 0x1f) >> ((uint)lVar4 & 0x1f) & 1) != 0));
      }
      pacVar6 = pacVar6 + 1;
      lVar4 = lVar4 + -1;
    }
    if ((short)uVar1 < 0) {
      fprintf((FILE *)syn68k_c_stream,"        %s = %d;\n",0x111cf0,
              (ulong)((uVar1 >> 0x14 & 1) == 0));
    }
    if ((postcode != (char *)0x0) && (*postcode != '\0')) {
      fprintf((FILE *)syn68k_c_stream,"        %s\n");
    }
    iVar7 = synthetic_opcode_size(map);
    if (info->ends_block == FALSE) {
      fprintf((FILE *)syn68k_c_stream,"        CASE_POSTAMBLE (ROUND_UP (%d))\n",
              (ulong)(uint)(iVar7 + info->operand_words_to_skip));
    }
    else {
      fputs("\n#ifdef PROFILE\n       profile_block (hash_lookup (READUL_US ((unsigned long)code - 4)));\n#endif\n"
            ,(FILE *)syn68k_c_stream);
      fwrite("#if SIZEOF_CHAR_P != 8\n\t    CHECK_FOR_INTERRUPT (READUL (US_TO_SYN68K (code - PTR_WORDS)));\n#else\n\t    CHECK_FOR_INTERRUPT (READUL_US (code - PTR_WORDS));\n#endif\n"
             ,0xa2,1,(FILE *)syn68k_c_stream);
      fwrite("        CASE_POSTAMBLE (ROUND_UP (PTR_WORDS))\n",0x2e,1,(FILE *)syn68k_c_stream);
    }
  }
  else {
    parse_error(pLVar3,"Expecting code description list!\n");
  }
  return;
}

Assistant:

void
generate_c_code (const ParsedOpcodeInfo *info, const CCVariant *var,
		 int m68kop, int synop, SymbolTable *sym,
		 const char *operand_decls, const char *postcode,
		 const OpcodeMappingInfo *map)
{
  static const char cc_name[][16] = { "cpu_state.ccc", "cpu_state.ccn",
					"cpu_state.ccv", "cpu_state.ccx",
					"cpu_state.ccnz" };
  char buf1[6], buf2[6], buf3[6], buf4[17];
  int opcw;
  List *code = copy_list (var->code);
  int i;

  /* Clear out preamble and postamble. */
  c_preamble[0] = c_postamble[0] = '\0';

  /* Replace $ elements with appropriate things. */
  code = replace_dollar_elements (code, m68kop, info, var);

  /* Simplify the resulting code. */
  code = reduce (code, sym, 0);

  /* Output human-readable comment describing this synthetic opcode. */
  fprintf (syn68k_c_stream,
	   "\n      /* %s %s ms:%s mns:%s needs:%s */\n",
	   info->name, opcode_bits_string (m68kop, info, var, buf4),
	   cc_bits_string (var->cc_may_set, buf1),
	   cc_bits_string (var->cc_may_not_set, buf2),
	   cc_bits_string (var->cc_needed, buf3));

  /* Output case. */
  fprintf (syn68k_c_stream, "      CASE (0x%04X)\n", (unsigned) synop);
  fprintf (syn68k_c_stream, "        CASE_PREAMBLE (\"%s\", \"%s\", \"%s\", "
	   "\"%s\", \"%s\")\n",
	   info->name, opcode_bits_string (m68kop, info, var, buf4),
	   cc_bits_string (var->cc_may_set, buf1),
	   cc_bits_string (var->cc_may_not_set, buf2),
	   cc_bits_string (var->cc_needed, buf3));

  /* Output operand declarations. */
  fputs (operand_decls, syn68k_c_stream);

  /* Transform temp variables only used as one type to temp_variables,
   * and output decls for those variables.
   */
  transform_reg_to_var_and_decl (code);

  /* Output temp variable declarations. */
  generate_temp_decls (code);

  if (code->token.type != TOK_LIST)
    {
      parse_error (code, "Expecting code description list!\n");
      return;
    }

  /* Output preamble. */
  if (c_preamble[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", c_preamble);
  
  /* Generate the code they specified. */
  fputs ("        ", syn68k_c_stream);
  generate_code_for_list (code, m68kop, info, var);
  fputs (";\n", syn68k_c_stream);
  
  /* Output postamble. */
  if (c_postamble[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", c_postamble);
  
  /* Set any cc bits to 0 or 1 that are explicitly mentioned in the
   * cc variant description.  This saves the user some work generating
   * the 68k description file and reduces the chance of error.
   */
  for (i = 0; i < 4; i++)
    if ((var->cc_to_known_value >> (4 - i)) & 1)
      fprintf (syn68k_c_stream, "        %s = %d;\n", cc_name[i],
	       (var->cc_known_values >> (4 - i)) & 1);
  if (var->cc_to_known_value & 1)   /* Invert sense of Z bit. */
    fprintf (syn68k_c_stream, "        %s = %d;\n", cc_name[4],
	     !(var->cc_known_values & 1));

  if (postcode != NULL && postcode[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", postcode);

  /* Count opcode words. */
  opcw = synthetic_opcode_size (map) + info->operand_words_to_skip;

  /* Only adjust code ptr if we didn't just end a block. */
  if (!info->ends_block)
    {
      /* Always increment enough so that the next opcode is guaranteed
       * to be a properly aligned pointer.
       */
      fprintf (syn68k_c_stream, "        CASE_POSTAMBLE (ROUND_UP (%d))\n",
	       (int) opcw);
    }

  else    /* If we end a block, profile the next block. */
    {
#if SIZEOF_CHAR_P != 8
      fputs ("\n#ifdef PROFILE\n"
	     "       profile_block (hash_lookup "
	     "(READUL (US_TO_SYN68K (code) - 4)));\n"
	     "#endif\n",
	     syn68k_c_stream);
#else
      fputs ("\n#ifdef PROFILE\n"
	     "       profile_block (hash_lookup "
	     "(READUL_US ((unsigned long)code - 4)));\n"
	     "#endif\n",
	     syn68k_c_stream);
#endif

#if defined (SYNCHRONOUS_INTERRUPTS) && !defined (GENERATE_NATIVE_CODE)
      fprintf (syn68k_c_stream,
"#if SIZEOF_CHAR_P != 8\n"
"	    CHECK_FOR_INTERRUPT (READUL (US_TO_SYN68K (code - PTR_WORDS)));\n"
"#else\n"
"	    CHECK_FOR_INTERRUPT (READUL_US (code - PTR_WORDS));\n"
"#endif\n");
#endif
      fprintf (syn68k_c_stream, "        CASE_POSTAMBLE "
	       "(ROUND_UP (PTR_WORDS))\n");
    }
  /* Done with this instruction. */
}